

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

EventLogEntry * __thiscall
TTD::EventLog::RecordJsRTCallFunction
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,int32 rootDepth,Var funcVar,
          uint32 argCount,Var *args)

{
  EventLogEntry *evt_00;
  int64 callEventTime;
  int64 local_68;
  int64 topLevelCallTime;
  int64 evtTime;
  EventLogEntry *evt;
  JsRTCallFunctionAction *cAction;
  Var *args_local;
  Var pvStack_28;
  uint32 argCount_local;
  Var funcVar_local;
  TTDJsRTActionResultAutoRecorder *pTStack_18;
  int32 rootDepth_local;
  TTDJsRTActionResultAutoRecorder *actionPopper_local;
  EventLog *this_local;
  
  evt = (EventLogEntry *)0x0;
  cAction = (JsRTCallFunctionAction *)args;
  args_local._4_4_ = argCount;
  pvStack_28 = funcVar;
  funcVar_local._4_4_ = rootDepth;
  pTStack_18 = actionPopper;
  actionPopper_local = (TTDJsRTActionResultAutoRecorder *)this;
  evt_00 = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                     (this,(JsRTCallFunctionAction **)&evt);
  callEventTime = GetLastEventTime(this);
  local_68 = callEventTime;
  if (funcVar_local._4_4_ != 0) {
    local_68 = this->m_topLevelCallbackEventTime;
  }
  NSLogEvents::JsRTCallFunctionAction_ProcessArgs
            (evt_00,funcVar_local._4_4_,callEventTime,pvStack_28,args_local._4_4_,&cAction->Result,
             local_68,&this->m_eventSlabAllocator);
  NSLogEvents::JsRTCallFunctionAction_ProcessDiagInfoPre
            (evt_00,pvStack_28,&this->m_eventSlabAllocator);
  TTDJsRTActionResultAutoRecorder::InitializeWithEventAndEnterWResult
            (pTStack_18,evt_00,(TTDVar *)evt);
  return evt_00;
}

Assistant:

NSLogEvents::EventLogEntry* EventLog::RecordJsRTCallFunction(TTDJsRTActionResultAutoRecorder& actionPopper, int32 rootDepth, Js::Var funcVar, uint32 argCount, Js::Var* args)
    {
        NSLogEvents::JsRTCallFunctionAction* cAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTCallFunctionAction, NSLogEvents::EventKind::CallExistingFunctionActionTag>(&cAction);

        int64 evtTime = this->GetLastEventTime();
        int64 topLevelCallTime = (rootDepth == 0) ? evtTime : this->m_topLevelCallbackEventTime;
        NSLogEvents::JsRTCallFunctionAction_ProcessArgs(evt, rootDepth, evtTime, funcVar, argCount, args, topLevelCallTime, this->m_eventSlabAllocator);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
        NSLogEvents::JsRTCallFunctionAction_ProcessDiagInfoPre(evt, funcVar, this->m_eventSlabAllocator);
#endif

        actionPopper.InitializeWithEventAndEnterWResult(evt, &(cAction->Result));

        return evt;
    }